

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::SimpleCompute::Setup(SimpleCompute *this)

{
  bool bVar1;
  GLuint GVar2;
  uint local_60;
  uint local_5c;
  GLint v [3];
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  SimpleCompute *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 1, local_size_y = 1) in;\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 1, local_size_y = 1) in;\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program,0x8267,(GLint *)&local_60);
    if (((local_60 == 1) && (local_5c == 1)) && (v[0] == 1)) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_buffer);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0);
      this_local = (SimpleCompute *)0x0;
    }
    else {
      anon_unknown_0::Output
                ("Got %d, %d, %d, expected: 1, 1, 1 in GL_COMPUTE_WORK_GROUP_SIZE check",
                 (ulong)local_60,(ulong)local_5c,(ulong)(uint)v[0]);
      this_local = (SimpleCompute *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (SimpleCompute *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Setup()
	{

		const char* const glsl_cs =
			NL "layout(local_size_x = 1, local_size_y = 1) in;" NL "layout(std430) buffer Output {" NL "  vec4 data;" NL
			   "} g_out;" NL "void main() {" NL "  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		GLint v[3];
		glGetProgramiv(m_program, GL_COMPUTE_WORK_GROUP_SIZE, v);
		if (v[0] != 1 || v[1] != 1 || v[2] != 1)
		{
			Output("Got %d, %d, %d, expected: 1, 1, 1 in GL_COMPUTE_WORK_GROUP_SIZE check", v[0], v[1], v[2]);
			return ERROR;
		}

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return NO_ERROR;
	}